

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLine.cpp
# Opt level: O2

double __thiscall
chrono::geometry::ChLine::CurveSegmentDistMax(ChLine *this,ChLine *complinesegm,int samples)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double approxU;
  undefined1 auVar3 [64];
  double dVar4;
  undefined1 auVar5 [16];
  double mpos;
  ChVector<double> ptA;
  ChVector<double> ptB;
  ChVector<double> result;
  double local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  ChVector<double> local_68;
  undefined1 local_48 [16];
  double local_38;
  undefined1 extraout_var [56];
  
  auVar5 = ZEXT816(0) << 0x40;
  dVar4 = 0.0;
  while (dVar4 < 1.0) {
    local_68.m_data[2] = 0.0;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    approxU = dVar4;
    (*(complinesegm->super_ChGeometry)._vptr_ChGeometry[0xb])(complinesegm,&local_68);
    FindNearestLinePoint(this,&local_68,&local_90,approxU,2e-05);
    local_78 = 0.0;
    local_88 = 0;
    uStack_80 = 0;
    (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])(local_90,this,&local_88);
    auVar1._8_8_ = uStack_80;
    auVar1._0_8_ = local_88;
    auVar2._8_8_ = local_68.m_data[1];
    auVar2._0_8_ = local_68.m_data[0];
    local_48 = vsubpd_avx(auVar1,auVar2);
    local_38 = local_78 - local_68.m_data[2];
    auVar3._0_8_ = ChVector<double>::Length((ChVector<double> *)local_48);
    auVar3._8_56_ = extraout_var;
    auVar5._8_8_ = 0;
    dVar4 = dVar4 + 1.0 / (double)samples;
    auVar5 = vmaxsd_avx(auVar3._0_16_,auVar5);
  }
  return auVar5._0_8_;
}

Assistant:

double ChLine::CurveSegmentDistMax(ChLine* complinesegm, int samples) const {
    double mres = 0;
    double par;
    double mdis;
    // distances this<->compare_line
    for (par = 0; par < 1; par = par + 1 / ((double)samples)) {
        double mpos;
        ChVector<> ptB;
        complinesegm->Evaluate(ptB, par);
        this->FindNearestLinePoint(ptB, mpos, 0, 0.00002);
        ChVector<> ptA;
        this->Evaluate(ptA, mpos);
        mdis = Vlength(Vsub(ptA, ptB));
        if (mres < mdis)
            mres = mdis;
    }
    return (mres);
}